

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_polygon_mesh.cpp
# Opt level: O0

string * __thiscall
geometrycentral::surface::SimplePolygonMesh::detectFileType
          (SimplePolygonMesh *this,string *filename)

{
  bool bVar1;
  iterator iVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __lhs;
  runtime_error *prVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  string *in_RDI;
  string extension;
  size_type sepInd;
  string *type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe38;
  _func_int_int *in_stack_fffffffffffffe40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe58;
  string *__lhs_00;
  string local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  undefined1 local_b9;
  string local_b8 [32];
  char *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  string local_68 [32];
  string local_48 [39];
  undefined1 local_21;
  long local_20;
  
  __lhs_00 = in_RDI;
  local_20 = ::std::__cxx11::string::rfind((char)in_RDX,0x2e);
  local_21 = 0;
  ::std::__cxx11::string::string((string *)in_RDI);
  if (local_20 == -1) {
    local_b9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::operator+((char *)__lhs_00,in_RDX);
    ::std::runtime_error::runtime_error(prVar3,local_b8);
    local_b9 = 0;
    __cxa_throw(prVar3,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::string(local_48);
  ::std::__cxx11::string::substr((ulong)local_68,(ulong)in_RDX);
  ::std::__cxx11::string::operator=(local_48,local_68);
  ::std::__cxx11::string::~string(local_68);
  local_80 = ::std::__cxx11::string::begin();
  local_88 = ::std::__cxx11::string::end();
  local_90 = ::std::__cxx11::string::begin();
  local_98 = (char *)::std::
                     transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                               (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                                in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  ::std::__cxx11::string::operator=((string *)in_RDI,local_48);
  ::std::__cxx11::string::~string(local_48);
  iVar2 = ::std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (in_stack_fffffffffffffe38);
  local_d0 = iVar2._M_current;
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ::std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       (in_stack_fffffffffffffe38);
  __lhs = ::std::
          find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                    (iVar2._M_current,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe48._M_current);
  local_c8 = __lhs._M_current;
  iVar2 = ::std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (in_stack_fffffffffffffe38);
  local_e0 = iVar2._M_current;
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)iVar2._M_current,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffe38);
  if (bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::operator+((char *)__lhs_00,in_RDX);
    ::std::operator+(__lhs._M_current,(char *)iVar2._M_current);
    ::std::operator+(__lhs._M_current,iVar2._M_current);
    ::std::operator+(__lhs._M_current,(char *)iVar2._M_current);
    ::std::runtime_error::runtime_error(prVar3,local_100);
    __cxa_throw(prVar3,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  return __lhs_00;
}

Assistant:

std::string SimplePolygonMesh::detectFileType(std::string filename) {
  std::string::size_type sepInd = filename.rfind('.');
  std::string type;

  if (sepInd != std::string::npos) {
    std::string extension;
    extension = filename.substr(sepInd + 1);

    // Convert to all lowercase
    std::transform(extension.begin(), extension.end(), extension.begin(), ::tolower);
    type = extension;
  } else {
    throw std::runtime_error("Could not auto-detect file type to load mesh from " + filename);
  }

  // Check if this is one of the filetypes we're aware of
  if (std::find(std::begin(supportedMeshTypes), std::end(supportedMeshTypes), type) == std::end(supportedMeshTypes)) {
    throw std::runtime_error("Detected file type " + type + " to load mesh from " + filename +
                             ". This is not a supported file type.");
  }

  return type;
}